

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  entry_type eVar1;
  pointer peVar2;
  ostream *poVar3;
  long lVar4;
  entry *it;
  pointer peVar5;
  char *pcVar6;
  
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar5 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar5 != peVar2; peVar5 = peVar5 + 1) {
    eVar1 = peVar5->type;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(peVar5->word)._M_dataplus._M_p,(peVar5->word)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    if (eVar1 == label) {
      lVar4 = 5;
      pcVar6 = "label";
    }
    else {
      lVar4 = 4;
      pcVar6 = "word";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (const auto& it : words_) {
    if (it.type == entry_type::label) {
        out << it.word << " " << it.count << " " << "label" << std::endl;
    } else {
        out << it.word << " " << it.count << " " << "word" << std::endl;
    }
  }
}